

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  void *pvVar1;
  DeathTest DVar2;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  int *piVar6;
  ostream *poVar7;
  size_t sVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  char flag;
  char buffer [256];
  char local_156;
  byte local_155;
  GTestLog local_154;
  void *local_150;
  long local_148;
  Message local_140;
  DeathTestImpl local_138 [5];
  
  do {
    sVar5 = read(this->read_fd_,&local_155,1);
    iVar3 = (int)sVar5;
    if (iVar3 != -1) {
      if (iVar3 == 0) {
        this->outcome_ = DIED;
        goto LAB_00112318;
      }
      if (iVar3 == 1) {
        if (local_155 < 0x52) {
          if (local_155 == 0x49) {
            iVar3 = this->read_fd_;
            Message::Message(&local_140);
            goto LAB_00112425;
          }
          if (local_155 == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_00112318;
          }
        }
        else {
          if (local_155 == 0x54) {
            this->outcome_ = THREW;
            goto LAB_00112318;
          }
          if (local_155 == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_00112318;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                           ,0x19e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        GTestLog::~GTestLog((GTestLog *)local_138);
        goto LAB_00112318;
      }
      break;
    }
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  GTestLog::GTestLog((GTestLog *)&local_150,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x1a3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription();
  DVar2._vptr_DeathTest = local_138[0].super_DeathTest._vptr_DeathTest;
  if (local_138[0].super_DeathTest._vptr_DeathTest == (_func_int **)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(null)",6);
  }
  else if (local_138[0].statement_ != (char *)0x0) {
    pcVar10 = (char *)0x0;
    do {
      if (*(char *)((long)DVar2._vptr_DeathTest + (long)pcVar10) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\0",2);
      }
      else {
        local_140.ss_.ptr_._0_1_ = *(char *)((long)DVar2._vptr_DeathTest + (long)pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(char *)&local_140,1);
      }
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != local_138[0].statement_);
  }
  if (local_138[0].super_DeathTest._vptr_DeathTest != (_func_int **)0x0) {
    operator_delete__(local_138[0].super_DeathTest._vptr_DeathTest);
  }
  GTestLog::~GTestLog((GTestLog *)&local_150);
  goto LAB_00112318;
  while( true ) {
    piVar6 = __errno_location();
    iVar9 = *piVar6;
    if (iVar9 != 4) break;
LAB_00112425:
    while( true ) {
      sVar5 = read(iVar3,local_138,0xff);
      uVar4 = (uint)sVar5;
      if ((int)uVar4 < 1) break;
      *(undefined1 *)
       ((long)&local_138[0].super_DeathTest._vptr_DeathTest + (ulong)(uVar4 & 0x7fffffff)) = 0;
      poVar7 = (ostream *)(CONCAT71(local_140.ss_.ptr_._1_7_,(char)local_140.ss_.ptr_) + 0x10);
      if (CONCAT71(local_140.ss_.ptr_._1_7_,(char)local_140.ss_.ptr_) == 0) {
        poVar7 = (ostream *)0x0;
      }
      sVar8 = strlen((char *)local_138);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_138,sVar8);
    }
    if (uVar4 != 0xffffffff) {
      if (uVar4 == 0) {
        GTestLog::GTestLog(&local_154,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                           ,0x11d);
        StringStreamToString
                  ((internal *)&local_150,
                   (stringstream *)CONCAT71(local_140.ss_.ptr_._1_7_,(char)local_140.ss_.ptr_));
        pvVar1 = local_150;
        if (local_150 == (void *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(null)",6);
        }
        else if (local_148 != 0) {
          lVar11 = 0;
          do {
            if (*(char *)((long)pvVar1 + lVar11) == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\0",2);
            }
            else {
              local_156 = *(char *)((long)pvVar1 + lVar11);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_156,1)
              ;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != local_148);
        }
        goto LAB_00112622;
      }
      piVar6 = __errno_location();
      iVar9 = *piVar6;
      break;
    }
  }
  GTestLog::GTestLog(&local_154,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                     ,0x120);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
  GetLastErrnoDescription();
  pvVar1 = local_150;
  if (local_150 == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(null)",6);
  }
  else if (local_148 != 0) {
    lVar11 = 0;
    do {
      if (*(char *)((long)pvVar1 + lVar11) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\0",2);
      }
      else {
        local_156 = *(char *)((long)pvVar1 + lVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_156,1);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != local_148);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," [",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
LAB_00112622:
  if (local_150 != (void *)0x0) {
    operator_delete__(local_150);
  }
  GTestLog::~GTestLog(&local_154);
  if ((long *)CONCAT71(local_140.ss_.ptr_._1_7_,(char)local_140.ss_.ptr_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_140.ss_.ptr_._1_7_,(char)local_140.ss_.ptr_) + 8))();
  }
LAB_00112318:
  do {
    iVar3 = close(this->read_fd_);
    if (iVar3 != -1) goto LAB_00112360;
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  this = local_138;
  String::Format((char *)this,"CHECK failed: File %s, line %d: %s != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x1a6,"posix::Close(read_fd())");
  DeathTestAbort((String *)this);
LAB_00112360:
  this->read_fd_ = -1;
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}